

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

int ReadLine(char *buffer,size_t size,_func_int *ReadFunction)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  lVar2 = 0;
  pcVar3 = buffer;
  do {
    iVar1 = (*ReadFunction)();
    if (iVar1 == -1) {
      *pcVar3 = '\0';
      size = -lVar2;
      break;
    }
    if ((char)iVar1 == '\r') {
      iVar1 = 0;
    }
    else if ((char)iVar1 == '\n') {
      *pcVar3 = '\0';
      size = 1 - lVar2;
      pcVar3 = buffer + size;
      break;
    }
    *pcVar3 = (char)iVar1;
    pcVar3 = pcVar3 + 1;
    lVar2 = lVar2 + -1;
  } while (size + lVar2 != 0);
  *pcVar3 = '\0';
  return (int)size;
}

Assistant:

int ReadLine(char* buffer, size_t size, int (*ReadFunction)())
{
    int i;
    char c;
    bool done = false;
    int bytesProcessed = 0;

    while (!done)
    {
        i = ReadFunction();
        if (i == -1)
        {
            *buffer = 0;
            break;
        }
        c = (char)i;
        bytesProcessed++;
        switch (c)
        {
        case '\r': *buffer++ = 0; break;
        case '\n':
            *buffer++ = 0;
            done = true;
            break;
        default: *buffer++ = c; break;
        }

        if (bytesProcessed == size)
        {
            break;
        }
    }

    *buffer = 0;
    return bytesProcessed;
}